

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::AllocateObjectLiteralTypeArray(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  Type *pTVar3;
  undefined4 *puVar4;
  ScriptContext *this_00;
  Recycler *pRVar5;
  DynamicType **objLiteralTypes;
  TrackAllocData local_40;
  uint local_14;
  FunctionBody *pFStack_10;
  uint objLiteralCount;
  FunctionBody *this_local;
  
  pFStack_10 = this;
  pTVar3 = GetObjectLiteralTypes(this);
  if (pTVar3 != (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x196a,"(this->GetObjectLiteralTypes() == nullptr)",
                                "this->GetObjectLiteralTypes() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_14 = GetObjLiteralCount(this);
  if (local_14 != 0) {
    this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
    pRVar5 = ScriptContext::GetRecycler(this_00);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&DynamicType*::typeinfo,0,(ulong)local_14,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1971);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
    objLiteralTypes =
         Memory::AllocateArray<Memory::Recycler,Js::DynamicType*,false>
                   ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)local_14);
    SetObjectLiteralTypes(this,objLiteralTypes);
  }
  return;
}

Assistant:

void FunctionBody::AllocateObjectLiteralTypeArray()
    {
        Assert(this->GetObjectLiteralTypes() == nullptr);
        uint objLiteralCount = GetObjLiteralCount();
        if (objLiteralCount == 0)
        {
            return;
        }

        this->SetObjectLiteralTypes(RecyclerNewArrayZ(this->GetScriptContext()->GetRecycler(), DynamicType *, objLiteralCount));
    }